

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_getiuservalue(lua_State *L,int idx,int n)

{
  StkId pSVar1;
  lua_CFunction p_Var2;
  TValue *pTVar3;
  TValue *io2;
  TValue *io1;
  int t;
  TValue *o;
  int n_local;
  int idx_local;
  lua_State *L_local;
  
  pTVar3 = index2value(L,idx);
  if ((n < 1) || ((int)(uint)*(ushort *)((pTVar3->value_).f + 10) < n)) {
    *(undefined1 *)((L->top).offset + 8) = 0;
    io1._4_4_ = 0xffffffff;
  }
  else {
    pSVar1 = (L->top).p;
    p_Var2 = (pTVar3->value_).f;
    (pSVar1->val).value_ = *(Value *)(p_Var2 + (long)(n + -1) * 0x10 + 0x28);
    (pSVar1->val).tt_ = ((Value *)(p_Var2 + (long)(n + -1) * 0x10 + 0x28))[1].ub;
    io1._4_4_ = *(byte *)((L->top).offset + 8) & 0xf;
  }
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return io1._4_4_;
}

Assistant:

LUA_API int lua_getiuservalue (lua_State *L, int idx, int n) {
  TValue *o;
  int t;
  lua_lock(L);
  o = index2value(L, idx);
  api_check(L, ttisfulluserdata(o), "full userdata expected");
  if (n <= 0 || n > uvalue(o)->nuvalue) {
    setnilvalue(s2v(L->top.p));
    t = LUA_TNONE;
  }
  else {
    setobj2s(L, L->top.p, &uvalue(o)->uv[n - 1].uv);
    t = ttype(s2v(L->top.p));
  }
  api_incr_top(L);
  lua_unlock(L);
  return t;
}